

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSchemaValidateLengthFacet(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val_00;
  unsigned_long *val_01;
  uint local_64;
  int n_length;
  unsigned_long *length;
  int n_val;
  xmlSchemaValPtr val;
  int n_value;
  xmlChar *value;
  int n_facet;
  xmlSchemaFacetPtr facet;
  int n_type;
  xmlSchemaTypePtr_conflict type;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (facet._4_4_ = 0; (int)facet._4_4_ < 1; facet._4_4_ = facet._4_4_ + 1) {
    for (value._4_4_ = 0; (int)value._4_4_ < 1; value._4_4_ = value._4_4_ + 1) {
      for (val._4_4_ = 0; (int)val._4_4_ < 5; val._4_4_ = val._4_4_ + 1) {
        for (length._4_4_ = 0; (int)length._4_4_ < 1; length._4_4_ = length._4_4_ + 1) {
          for (local_64 = 0; (int)local_64 < 2; local_64 = local_64 + 1) {
            iVar1 = xmlMemBlocks();
            val_00 = gen_const_xmlChar_ptr(val._4_4_,2);
            val_01 = gen_unsigned_long_ptr(local_64,4);
            iVar2 = xmlSchemaValidateLengthFacet(0,0,val_00,0,val_01);
            desret_int(iVar2);
            call_tests = call_tests + 1;
            des_const_xmlChar_ptr(val._4_4_,val_00,2);
            des_unsigned_long_ptr(local_64,val_01,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSchemaValidateLengthFacet",
                     (ulong)(uint)(iVar2 - iVar1));
              ret_val = ret_val + 1;
              printf(" %d",(ulong)facet._4_4_);
              printf(" %d",(ulong)value._4_4_);
              printf(" %d",(ulong)val._4_4_);
              printf(" %d",(ulong)length._4_4_);
              printf(" %d",(ulong)local_64);
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSchemaValidateLengthFacet(void) {
    int test_ret = 0;

#if defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlSchemaTypePtr type; /* the built-in type */
    int n_type;
    xmlSchemaFacetPtr facet; /* the facet to check */
    int n_facet;
    xmlChar * value; /* the lexical repr. of the value to be validated */
    int n_value;
    xmlSchemaValPtr val; /* the precomputed value */
    int n_val;
    unsigned long * length; /* the actual length of the value */
    int n_length;

    for (n_type = 0;n_type < gen_nb_xmlSchemaTypePtr;n_type++) {
    for (n_facet = 0;n_facet < gen_nb_xmlSchemaFacetPtr;n_facet++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
    for (n_val = 0;n_val < gen_nb_xmlSchemaValPtr;n_val++) {
    for (n_length = 0;n_length < gen_nb_unsigned_long_ptr;n_length++) {
        mem_base = xmlMemBlocks();
        type = gen_xmlSchemaTypePtr(n_type, 0);
        facet = gen_xmlSchemaFacetPtr(n_facet, 1);
        value = gen_const_xmlChar_ptr(n_value, 2);
        val = gen_xmlSchemaValPtr(n_val, 3);
        length = gen_unsigned_long_ptr(n_length, 4);

        ret_val = xmlSchemaValidateLengthFacet(type, facet, (const xmlChar *)value, val, length);
        desret_int(ret_val);
        call_tests++;
        des_xmlSchemaTypePtr(n_type, type, 0);
        des_xmlSchemaFacetPtr(n_facet, facet, 1);
        des_const_xmlChar_ptr(n_value, (const xmlChar *)value, 2);
        des_xmlSchemaValPtr(n_val, val, 3);
        des_unsigned_long_ptr(n_length, length, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSchemaValidateLengthFacet",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_type);
            printf(" %d", n_facet);
            printf(" %d", n_value);
            printf(" %d", n_val);
            printf(" %d", n_length);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}